

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddAgent
          (TransitionObservationIndependentMADPDiscrete *this,string *namestring)

{
  ostream *poVar1;
  MultiAgentDecisionProcessDiscrete *this_00;
  MultiAgentDecisionProcessDiscrete *m;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  stringstream pf;
  ostream local_4a8 [376];
  stringstream descr;
  ostream local_320 [376];
  stringstream name;
  ostream local_198 [376];
  
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
  std::__cxx11::string::string((string *)&local_4d8,(string *)namestring);
  MultiAgentDecisionProcess::AddAgent(&this->super_MultiAgentDecisionProcess,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  std::__cxx11::stringstream::stringstream((stringstream *)&descr);
  std::__cxx11::stringstream::stringstream((stringstream *)&pf);
  poVar1 = std::operator<<(local_198,"Indiv.MADPDiscr.Agent");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(local_320,
                           "The individual MADPDiscrete used to model the transition and observation dynamics for agent "
                          );
  poVar1 = std::operator<<(poVar1,(string *)namestring);
  poVar1 = std::operator<<(poVar1,"(agent ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,")");
  MultiAgentDecisionProcess::GetProblemFile_abi_cxx11_
            (&local_538,&this->super_MultiAgentDecisionProcess);
  poVar1 = std::operator<<(local_4a8,(string *)&local_538);
  poVar1 = std::operator<<(poVar1,".agent");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::string::~string((string *)&local_538);
  this_00 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x208);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (this_00,1,0,&local_538,&local_4f8,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_538);
  m = this_00;
  MultiAgentDecisionProcessDiscrete::SetSparse(this_00,this->_m_sparse);
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::push_back(&this->_m_individualMADPDs,&m);
  (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x30))(this,0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&pf);
  std::__cxx11::stringstream::~stringstream((stringstream *)&descr);
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  return;
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddAgent(const string &namestring)
{
    Index i = GetNrAgents();//the old number of agents
    MultiAgentDecisionProcess::AddAgent(namestring);

    stringstream name, descr, pf;
    name << "Indiv.MADPDiscr.Agent"<<i;
    descr << "The individual MADPDiscrete used to model the transition \
and observation dynamics for agent "<<namestring <<"(agent "<<i<<")";
    pf << GetProblemFile() << ".agent" << i;

    MultiAgentDecisionProcessDiscrete* m = new 
        MultiAgentDecisionProcessDiscrete(1, 0, name.str(), descr.str(),
               pf.str() );
    m->SetSparse(_m_sparse);
    _m_individualMADPDs.push_back( m );

    SetInitialized(false);
}